

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::SetScissorRects
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,Uint32 NumRects,Rect *pRects,
          Uint32 *RTWidth,Uint32 *RTHeight)

{
  String *__return_storage_ptr__;
  Int32 IVar1;
  bool bVar2;
  COMMAND_QUEUE_TYPE CVar3;
  Char *pCVar4;
  RenderDeviceGLImpl *this_00;
  DeviceFeatures *pDVar5;
  uint *puVar6;
  Rect *pRVar7;
  Rect *pRVar8;
  COMMAND_QUEUE_TYPE Type;
  char (*in_R9) [8];
  string *in_stack_fffffffffffffe78;
  undefined1 local_148 [8];
  string msg_6;
  string msg_5;
  undefined1 local_100 [4];
  Uint32 sr;
  string msg_4;
  string msg_3;
  undefined1 local_a0 [8];
  string msg_2;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  Uint32 *RTHeight_local;
  Uint32 *RTWidth_local;
  Rect *pRects_local;
  DeviceContextBase<Diligent::EngineGLImplTraits> *pDStack_10;
  Uint32 NumRects_local;
  DeviceContextBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._8_8_ = RTHeight;
  pRects_local._4_4_ = NumRects;
  pDStack_10 = this;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar2 = IsDeferred(this);
    if (!bVar2) {
      FormatString<char[79]>
                ((string *)local_50,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"SetScissorRects",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x3c5);
      std::__cxx11::string::~string((string *)local_50);
    }
    FormatString<char[97]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"SetScissorRects",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x3c5);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  CVar3 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_GRAPHICS);
  if (CVar3 != COMMAND_QUEUE_TYPE_GRAPHICS) {
    __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
    GetCommandQueueTypeString_abi_cxx11_
              (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
    FormatString<char[16],char[22],std::__cxx11::string,char[8]>
              ((string *)local_a0,(Diligent *)"SetScissorRects",(char (*) [16])0xf4cb59,
               (char (*) [22])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"SetScissorRects",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x3c5);
    std::__cxx11::string::~string((string *)local_a0);
  }
  if (1 < pRects_local._4_4_) {
    this_00 = RefCntAutoPtr<Diligent::RenderDeviceGLImpl>::operator->(&this->m_pDevice);
    pDVar5 = RenderDeviceBase<Diligent::EngineGLImplTraits>::GetFeatures
                       (&this_00->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
    if (pDVar5->MultiViewport == DEVICE_FEATURE_STATE_DISABLED) {
      FormatString<char[80]>
                ((string *)((long)&msg_4.field_2 + 8),
                 (char (*) [80])
                 "IDeviceContext::SetScissorRects: multi viewport is not supported by this device");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"SetScissorRects",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x3ca);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
  }
  if ((*RTWidth == 0) || (*(int *)msg.field_2._8_8_ == 0)) {
    *RTWidth = this->m_FramebufferWidth;
    *(Uint32 *)msg.field_2._8_8_ = this->m_FramebufferHeight;
  }
  if (0xf < pRects_local._4_4_) {
    FormatString<char[26],unsigned_int,char[22],unsigned_int,char[2]>
              ((string *)local_100,(Diligent *)"Number of scissor rects (",
               (char (*) [26])((long)&pRects_local + 4),(uint *)") exceeds the limit (",
               (char (*) [22])&MAX_VIEWPORTS,(uint *)0xf65f2d,
               (char (*) [2])in_stack_fffffffffffffe78);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"SetScissorRects",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x3d2);
    std::__cxx11::string::~string((string *)local_100);
  }
  puVar6 = std::min<unsigned_int>(&MAX_VIEWPORTS,(uint *)((long)&pRects_local + 4));
  this->m_NumScissorRects = *puVar6;
  for (msg_5.field_2._12_4_ = 0; (uint)msg_5.field_2._12_4_ < this->m_NumScissorRects;
      msg_5.field_2._12_4_ = msg_5.field_2._12_4_ + 1) {
    pRVar8 = pRects + (uint)msg_5.field_2._12_4_;
    pRVar7 = this->m_ScissorRects + (uint)msg_5.field_2._12_4_;
    IVar1 = pRVar8->top;
    pRVar7->left = pRVar8->left;
    pRVar7->top = IVar1;
    IVar1 = pRVar8->bottom;
    pRVar7->right = pRVar8->right;
    pRVar7->bottom = IVar1;
    if (this->m_ScissorRects[(uint)msg_5.field_2._12_4_].right <
        this->m_ScissorRects[(uint)msg_5.field_2._12_4_].left) {
      FormatString<char[49],int,char[3],int,char[2]>
                ((string *)((long)&msg_6.field_2 + 8),
                 (Diligent *)"Incorrect horizontal bounds for a scissor rect [",
                 (char (*) [49])(this->m_ScissorRects + (uint)msg_5.field_2._12_4_),(int *)0xf64f1c,
                 (char (*) [3])&this->m_ScissorRects[(uint)msg_5.field_2._12_4_].right,
                 (int *)0xf65f2d,(char (*) [2])in_stack_fffffffffffffe78);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"SetScissorRects",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x3d8);
      std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
    }
    if (this->m_ScissorRects[(uint)msg_5.field_2._12_4_].bottom <
        this->m_ScissorRects[(uint)msg_5.field_2._12_4_].top) {
      in_stack_fffffffffffffe78 = (string *)local_148;
      FormatString<char[47],int,char[3],int,char[2]>
                (in_stack_fffffffffffffe78,
                 (Diligent *)"Incorrect vertical bounds for a scissor rect [",
                 (char (*) [47])&this->m_ScissorRects[(uint)msg_5.field_2._12_4_].top,
                 (int *)0xf64f1c,
                 (char (*) [3])&this->m_ScissorRects[(uint)msg_5.field_2._12_4_].bottom,
                 (int *)0xf65f2d,(char (*) [2])in_stack_fffffffffffffe78);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"SetScissorRects",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x3d9);
      std::__cxx11::string::~string((string *)local_148);
    }
  }
  (this->m_Stats).CommandCounters.SetScissorRects =
       (this->m_Stats).CommandCounters.SetScissorRects + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::SetScissorRects(
    Uint32      NumRects,
    const Rect* pRects,
    Uint32&     RTWidth,
    Uint32&     RTHeight)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "SetScissorRects");

    if (NumRects > 1)
    {
        DEV_CHECK_ERR(m_pDevice->GetFeatures().MultiViewport,
                      "IDeviceContext::SetScissorRects: multi viewport is not supported by this device");
    }
    if (RTWidth == 0 || RTHeight == 0)
    {
        RTWidth  = m_FramebufferWidth;
        RTHeight = m_FramebufferHeight;
    }

    DEV_CHECK_ERR(NumRects < MAX_VIEWPORTS, "Number of scissor rects (", NumRects, ") exceeds the limit (", MAX_VIEWPORTS, ")");
    m_NumScissorRects = (std::min)(MAX_VIEWPORTS, NumRects);

    for (Uint32 sr = 0; sr < m_NumScissorRects; ++sr)
    {
        m_ScissorRects[sr] = pRects[sr];
        DEV_CHECK_ERR(m_ScissorRects[sr].left <= m_ScissorRects[sr].right, "Incorrect horizontal bounds for a scissor rect [", m_ScissorRects[sr].left, ", ", m_ScissorRects[sr].right, ")");
        DEV_CHECK_ERR(m_ScissorRects[sr].top <= m_ScissorRects[sr].bottom, "Incorrect vertical bounds for a scissor rect [", m_ScissorRects[sr].top, ", ", m_ScissorRects[sr].bottom, ")");
    }

    ++m_Stats.CommandCounters.SetScissorRects;
}